

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celt_lpc.c
# Opt level: O1

void celt_iir(opus_val32 *_x,opus_val16 *den,opus_val32 *_y,int N,int ord,opus_val16 *mem)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  float *pfVar8;
  ulong uVar9;
  opus_val16 *poVar10;
  float *pfVar11;
  undefined4 in_register_00000084;
  undefined8 uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  float *pfVar16;
  ulong uVar17;
  float fVar18;
  opus_val32 oVar19;
  float fVar20;
  opus_val32 oVar21;
  float fVar22;
  opus_val32 oVar23;
  float fVar24;
  float fVar25;
  opus_val32 oVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined8 uStack_70;
  float afStack_68 [2];
  long local_60;
  undefined8 local_58;
  opus_val32 *local_50;
  long local_48;
  opus_val16 *local_40;
  uint local_34;
  
  uVar17 = (ulong)(uint)ord;
  pfVar16 = (float *)((long)afStack_68 - (uVar17 * 4 + 0xf & 0xfffffffffffffff0));
  uVar6 = ord + N;
  lVar14 = (long)pfVar16 - ((ulong)uVar6 * 4 + 0xf & 0xfffffffffffffff0);
  pfVar8 = pfVar16;
  uVar9 = uVar17;
  if (0 < ord) {
    do {
      *pfVar8 = den[uVar9 - 1];
      uVar9 = uVar9 - 1;
      pfVar8 = pfVar8 + 1;
    } while (uVar9 != 0);
  }
  if (ord < 1) {
    uVar9 = 0;
  }
  else {
    poVar10 = mem + uVar17;
    uVar9 = 0;
    do {
      poVar10 = poVar10 + -1;
      *(float *)(lVar14 + uVar9 * 4) = -*poVar10;
      uVar9 = uVar9 + 1;
    } while (uVar17 != uVar9);
  }
  local_58 = CONCAT44(in_register_00000084,ord);
  local_50 = _x;
  local_48 = lVar14;
  local_40 = mem;
  if ((int)(uint)uVar9 < (int)uVar6) {
    *(undefined8 *)(lVar14 + -8) = 0x1018a9;
    memset((void *)(lVar14 + (uVar9 & 0xffffffff) * 4),0,(ulong)(uVar6 + ~(uint)uVar9) * 4 + 4);
  }
  uVar6 = (uint)local_58;
  uVar9 = 0;
  if (3 < N) {
    iVar7 = uVar6 - 3;
    local_34 = uVar6 & 0x7ffffffc;
    local_60 = (long)(N + -3);
    lVar14 = local_48 + (long)(int)uVar6 * 4;
    uVar9 = 0;
    uVar12 = local_58;
    do {
      uVar5 = local_58;
      oVar26 = local_50[uVar9];
      oVar21 = local_50[uVar9 + 1];
      oVar23 = local_50[uVar9 + 2];
      oVar19 = local_50[uVar9 + 3];
      pfVar8 = (float *)(local_48 + uVar9 * 4);
      pfVar11 = pfVar8 + 3;
      fVar29 = *pfVar8;
      fVar22 = pfVar8[1];
      fVar24 = pfVar8[2];
      fVar27 = 0.0;
      uVar6 = 0;
      pfVar8 = pfVar16;
      uVar13 = uVar6;
      if (3 < (int)uVar12) {
        do {
          fVar27 = *pfVar11;
          fVar1 = *pfVar8;
          fVar2 = pfVar8[1];
          fVar28 = fVar29 * fVar1;
          fVar25 = fVar1 * fVar22;
          fVar30 = fVar22 * fVar2;
          fVar29 = pfVar11[1];
          fVar20 = fVar1 * fVar24;
          fVar18 = fVar2 * fVar24;
          fVar3 = pfVar8[2];
          fVar22 = pfVar11[2];
          fVar4 = pfVar8[3];
          pfVar8 = pfVar8 + 4;
          oVar26 = (opus_val32)(fVar4 * fVar27 + fVar24 * fVar3 + fVar30 + fVar28 + (float)oVar26);
          fVar24 = pfVar11[3];
          pfVar11 = pfVar11 + 4;
          oVar21 = (opus_val32)(fVar4 * fVar29 + fVar3 * fVar27 + fVar18 + fVar25 + (float)oVar21);
          oVar23 = (opus_val32)
                   (fVar4 * fVar22 + fVar3 * fVar29 + fVar2 * fVar27 + fVar20 + (float)oVar23);
          oVar19 = (opus_val32)
                   (fVar4 * fVar24 +
                   fVar3 * fVar22 + fVar2 * fVar29 + fVar1 * fVar27 + (float)oVar19);
          uVar6 = uVar6 + 4;
          uVar13 = local_34;
        } while ((int)uVar6 < iVar7);
      }
      if ((int)uVar13 < (int)uVar12) {
        fVar1 = *pfVar8;
        pfVar8 = pfVar8 + 1;
        fVar27 = *pfVar11;
        pfVar11 = pfVar11 + 1;
        oVar26 = (opus_val32)((float)oVar26 + fVar1 * fVar29);
        oVar21 = (opus_val32)((float)oVar21 + fVar1 * fVar22);
        oVar23 = (opus_val32)((float)oVar23 + fVar1 * fVar24);
        oVar19 = (opus_val32)((float)oVar19 + fVar1 * fVar27);
      }
      uVar6 = (uint)local_58;
      if ((int)(uVar13 | 1) < (int)uVar6) {
        fVar1 = *pfVar8;
        pfVar8 = pfVar8 + 1;
        fVar29 = *pfVar11;
        pfVar11 = pfVar11 + 1;
        oVar26 = (opus_val32)((float)oVar26 + fVar22 * fVar1);
        oVar21 = (opus_val32)((float)oVar21 + fVar1 * fVar24);
        oVar23 = (opus_val32)((float)oVar23 + fVar1 * fVar27);
        oVar19 = (opus_val32)((float)oVar19 + fVar1 * fVar29);
      }
      if ((int)(uVar13 | 2) < (int)uVar6) {
        fVar22 = *pfVar8;
        oVar26 = (opus_val32)((float)oVar26 + fVar24 * fVar22);
        oVar21 = (opus_val32)((float)oVar21 + fVar27 * fVar22);
        oVar23 = (opus_val32)((float)oVar23 + fVar29 * fVar22);
        oVar19 = (opus_val32)((float)oVar19 + fVar22 * *pfVar11);
      }
      *(float *)(lVar14 + uVar9 * 4) = -(float)oVar26;
      _y[uVar9] = oVar26;
      fVar22 = (float)oVar21 - *den * (float)oVar26;
      *(float *)(lVar14 + 4 + uVar9 * 4) = -fVar22;
      _y[uVar9 | 1] = (opus_val32)fVar22;
      fVar24 = ((float)oVar23 - *den * fVar22) - den[1] * (float)oVar26;
      *(float *)(lVar14 + 8 + uVar9 * 4) = -fVar24;
      _y[uVar9 | 2] = (opus_val32)fVar24;
      fVar22 = (((float)oVar19 - fVar24 * *den) - fVar22 * den[1]) - (float)oVar26 * den[2];
      *(float *)(lVar14 + 0xc + uVar9 * 4) = -fVar22;
      _y[uVar9 | 3] = (opus_val32)fVar22;
      uVar9 = uVar9 + 4;
      uVar12 = uVar5;
    } while ((long)uVar9 < local_60);
  }
  if ((int)uVar9 < N) {
    uVar9 = uVar9 & 0xffffffff;
    lVar14 = local_48 + uVar9 * 4;
    do {
      oVar26 = local_50[uVar9];
      if (0 < (int)uVar6) {
        uVar15 = 0;
        do {
          oVar26 = (opus_val32)((float)oVar26 - pfVar16[uVar15] * *(float *)(lVar14 + uVar15 * 4));
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      *(opus_val32 *)(local_48 + (long)(int)uVar6 * 4 + uVar9 * 4) = oVar26;
      _y[uVar9] = oVar26;
      uVar9 = uVar9 + 1;
      lVar14 = lVar14 + 4;
    } while (uVar9 != (uint)N);
  }
  if (0 < (int)uVar6) {
    iVar7 = N + -1;
    uVar9 = 0;
    do {
      local_40[uVar9] = (opus_val16)_y[iVar7];
      uVar9 = uVar9 + 1;
      iVar7 = iVar7 + -1;
    } while (uVar17 != uVar9);
  }
  return;
}

Assistant:

void celt_iir(const opus_val32 *_x,
              const opus_val16 *den,
              opus_val32 *_y,
              int N,
              int ord,
              opus_val16 *mem) {
#ifdef SMALL_FOOTPRINT
    int i,j;
    for (i=0;i<N;i++)
    {
       opus_val32 sum = _x[i];
       for (j=0;j<ord;j++)
       {
          sum -= MULT16_16(den[j],mem[j]);
       }
       for (j=ord-1;j>=1;j--)
       {
          mem[j]=mem[j-1];
       }
       mem[0] = SROUND16(sum, SIG_SHIFT);
       _y[i] = sum;
    }
#else
    int i, j;
    celt_assert((ord & 3) == 0);
    opus_val16 rden[ord];
    opus_val16 y[N + ord];
    for (i = 0; i < ord; i++)
        rden[i] = den[ord - i - 1];
    for (i = 0; i < ord; i++)
        y[i] = -mem[ord - i - 1];
    for (; i < N + ord; i++)
        y[i] = 0;
    for (i = 0; i < N - 3; i += 4) {
        /* Unroll by 4 as if it were an FIR filter */
        opus_val32 sum[4];
        sum[0] = _x[i];
        sum[1] = _x[i + 1];
        sum[2] = _x[i + 2];
        sum[3] = _x[i + 3];
        xcorr_kernel(rden, y + i, sum, ord);

        /* Patch up the result to compensate for the fact that this is an IIR */
        y[i + ord] = -SROUND16(sum[0], SIG_SHIFT);
        _y[i] = sum[0];
        sum[1] = MAC16_16(sum[1], y[i + ord], den[0]);
        y[i + ord + 1] = -SROUND16(sum[1], SIG_SHIFT);
        _y[i + 1] = sum[1];
        sum[2] = MAC16_16(sum[2], y[i + ord + 1], den[0]);
        sum[2] = MAC16_16(sum[2], y[i + ord], den[1]);
        y[i + ord + 2] = -SROUND16(sum[2], SIG_SHIFT);
        _y[i + 2] = sum[2];

        sum[3] = MAC16_16(sum[3], y[i + ord + 2], den[0]);
        sum[3] = MAC16_16(sum[3], y[i + ord + 1], den[1]);
        sum[3] = MAC16_16(sum[3], y[i + ord], den[2]);
        y[i + ord + 3] = -SROUND16(sum[3], SIG_SHIFT);
        _y[i + 3] = sum[3];
    }
    for (; i < N; i++) {
        opus_val32 sum = _x[i];
        for (j = 0; j < ord; j++)
            sum -= MULT16_16(rden[j], y[i + j]);
        y[i + ord] = SROUND16(sum, SIG_SHIFT);
        _y[i] = sum;
    }
    for (i = 0; i < ord; i++)
        mem[i] = _y[N - i - 1];
#endif
}